

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalBatchCopyToFile::Sink
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  BatchMemoryManager *this_00;
  atomic<unsigned_long> *paVar1;
  FixedBatchCopyGlobalState *this_01;
  FixedBatchCopyLocalState *this_02;
  ClientContext *context_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  idx_t iVar5;
  idx_t current_min_batch_index;
  pointer pCVar6;
  InternalException *this_03;
  SinkResultType SVar7;
  unique_lock<std::mutex> guard;
  undefined1 local_50 [32];
  
  this_01 = (FixedBatchCopyGlobalState *)input->global_state;
  this_02 = (FixedBatchCopyLocalState *)input->local_state;
  this_00 = &this_01->memory_manager;
  iVar5 = optional_idx::GetIndex(&(this_02->super_LocalSinkState).partition_info.batch_index);
  if (this_02->current_task == PROCESSING_TASKS) {
    context_00 = context->client;
    do {
      bVar3 = ExecuteTask(this,context_00,(GlobalSinkState *)this_01);
    } while (bVar3);
    FlushBatchData(this,context->client,(GlobalSinkState *)this_01);
    if (((this_01->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i < iVar5)
       && (bVar3 = BatchMemoryManager::OutOfMemory(this_00,iVar5), bVar3)) {
      local_50._0_8_ = &(this_01->memory_manager).super_StateWithBlockableTasks.lock;
      local_50[8] = false;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
      local_50[8] = true;
      if ((this_01->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i < iVar5)
      {
        SVar7 = FINISHED;
        if (((this_00->super_StateWithBlockableTasks).can_block._M_base._M_i & 1U) != 0) {
          SVar7 = BLOCKED;
          ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::push_back
                    (&(this_01->memory_manager).super_StateWithBlockableTasks.blocked_tasks.
                      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>,
                     input->interrupt_state);
        }
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
        return SVar7;
      }
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    }
    this_02->current_task = SINKING_DATA;
  }
  if ((this_01->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i < iVar5) {
    current_min_batch_index =
         optional_idx::GetIndex(&(this_02->super_LocalSinkState).partition_info.min_batch_index);
    BatchMemoryManager::UpdateMinBatchIndex(this_00,current_min_batch_index);
    bVar3 = BatchMemoryManager::OutOfMemory(this_00,iVar5);
    if (bVar3) {
      this_02->current_task = PROCESSING_TASKS;
      iVar4 = (*(this->super_PhysicalOperator)._vptr_PhysicalOperator[0x1a])
                        (this,context,chunk,input);
      return (SinkResultType)iVar4;
    }
  }
  if (this->write_empty_file == false) {
    FixedBatchCopyGlobalState::Initialize(this_01,context->client,this);
  }
  if ((this_02->collection).
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
      (ColumnDataCollection *)0x0) {
    FixedBatchCopyLocalState::InitializeCollection
              (this_02,context->client,&this->super_PhysicalOperator);
    optional_idx::optional_idx((optional_idx *)local_50,iVar5);
    (this_02->batch_index).index = local_50._0_8_;
  }
  this_02->rows_copied = this_02->rows_copied + chunk->count;
  pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this_02->collection);
  ColumnDataCollection::Append(pCVar6,&this_02->append_state,chunk);
  pCVar6 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this_02->collection);
  iVar5 = ColumnDataCollection::AllocationSize(pCVar6);
  uVar2 = this_02->local_memory_usage;
  if (iVar5 < uVar2 || iVar5 - uVar2 == 0) {
    if (iVar5 < uVar2) {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"PhysicalFixedBatchCopy - memory usage decreased somehow?","");
      InternalException::InternalException(this_03,(string *)local_50);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    LOCK();
    paVar1 = &(this_01->memory_manager).unflushed_memory_usage;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + (iVar5 - uVar2);
    UNLOCK();
    this_02->local_memory_usage = iVar5;
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalBatchCopyToFile::Sink(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSinkInput &input) const {
	auto &state = input.local_state.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;
	auto batch_index = state.partition_info.batch_index.GetIndex();
	if (state.current_task == FixedBatchCopyState::PROCESSING_TASKS) {
		ExecuteTasks(context.client, gstate);
		FlushBatchData(context.client, gstate);

		if (!memory_manager.IsMinimumBatchIndex(batch_index) && memory_manager.OutOfMemory(batch_index)) {
			auto guard = memory_manager.Lock();
			if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
				// no tasks to process, we are not the minimum batch index and we have no memory available to buffer
				// block the task for now
				return memory_manager.BlockSink(guard, input.interrupt_state);
			}
		}
		state.current_task = FixedBatchCopyState::SINKING_DATA;
	}
	if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
		memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());

		// we are not processing the current min batch index
		// check if we have exceeded the maximum number of unflushed rows
		if (memory_manager.OutOfMemory(batch_index)) {
			// out-of-memory - stop sinking chunks and instead assist in processing tasks for the minimum batch index
			state.current_task = FixedBatchCopyState::PROCESSING_TASKS;
			return Sink(context, chunk, input);
		}
	}
	if (!write_empty_file) {
		// if we are not writing empty files - initialize after we have received rows
		gstate.Initialize(context.client, *this);
	}
	if (!state.collection) {
		state.InitializeCollection(context.client, *this);
		state.batch_index = batch_index;
	}
	state.rows_copied += chunk.size();
	state.collection->Append(state.append_state, chunk);
	auto new_memory_usage = state.collection->AllocationSize();
	if (new_memory_usage > state.local_memory_usage) {
		// memory usage increased - add to global state
		memory_manager.IncreaseUnflushedMemory(new_memory_usage - state.local_memory_usage);
		state.local_memory_usage = new_memory_usage;
	} else if (new_memory_usage < state.local_memory_usage) {
		throw InternalException("PhysicalFixedBatchCopy - memory usage decreased somehow?");
	}
	return SinkResultType::NEED_MORE_INPUT;
}